

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.h
# Opt level: O2

void __thiscall XTreeNode::~XTreeNode(XTreeNode *this)

{
  ~XTreeNode(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~XTreeNode() { removeElements(); }